

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

void dbg_text(char *tgt,int min,int max,int sd)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  distribution *s;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  long *target;
  char *pcVar13;
  byte *pbVar14;
  char *__dest;
  char *pcVar16;
  int local_18c;
  long hgLength;
  long hgOffset;
  byte local_145 [13];
  char sentence [257];
  byte *pbVar15;
  
  hgLength = 0;
  if (dbg_text_bInit != '\0') {
LAB_00106ec6:
    dss_random(&hgOffset,0,(long)(0x12c00000 - max),(long)sd);
    dss_random(&hgLength,(long)min,(long)max,(long)sd);
    lVar10 = hgLength;
    strncpy(tgt,dbg_text::szTextPool + hgOffset,(long)(int)hgLength);
    tgt[lVar10] = '\0';
    return;
  }
  if (0 < verbose) {
    fwrite("\nPreloading text ... ",0x15,1,_stderr);
  }
  pcVar13 = (char *)0x0;
  __dest = dbg_text::szTextPool;
  local_18c = 0;
LAB_00106bfc:
  pcVar16 = sentence;
  if ((long)pcVar13 < 0x12c00000) {
    if ((0 < verbose) && ((long)local_18c < (long)pcVar13)) {
      local_18c = local_18c + 200000;
      fprintf(_stderr,"%3.0f%%\b\b\b\b",((double)(long)pcVar13 * 100.0) / 314572800.0);
    }
    pcVar12 = (char *)0x5;
    pick_str(&grammar,5,(char *)local_145);
    iVar3 = 0;
    sVar9 = 0;
    pbVar15 = local_145;
LAB_00106c50:
    do {
      pbVar14 = pbVar15 + 1;
      bVar1 = *pbVar15;
      pbVar15 = pbVar14;
    } while (bVar1 == 0x20);
    switch(bVar1) {
    case 0x4e:
      uVar4 = txt_np(pcVar16,(int)pcVar12);
      sVar9 = (size_t)uVar4;
      break;
    case 0x4f:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x55:
      break;
    case 0x50:
      pcVar12 = (char *)0x5;
      iVar5 = pick_str(&prepositions,5,pcVar16);
      sVar9 = strlen(prepositions.list[iVar5].text);
      iVar5 = (int)sVar9;
      builtin_strncpy(pcVar16 + iVar5," the ",6);
      iVar6 = txt_np(pcVar16 + iVar5 + 5,(int)pcVar12);
      sVar9 = (size_t)(iVar5 + iVar6 + 5);
      break;
    case 0x54:
      pcVar16 = pcVar16 + -1;
      pcVar12 = (char *)0x5;
      iVar5 = pick_str(&terminators,5,pcVar16);
      sVar9 = strlen(terminators.list[iVar5].text);
      break;
    case 0x56:
      target = &hgOffset;
      pick_str(&vp,5,(char *)target);
      sVar9 = 0;
      pcVar11 = pcVar16;
      while( true ) {
        pcVar12 = " ";
        pcVar7 = strtok((char *)target," ");
        if (pcVar7 == (char *)0x0) break;
        cVar2 = *pcVar7;
        if (cVar2 == 'X') {
          s = &auxillaries;
        }
        else if (cVar2 == 'V') {
          s = &verbs;
        }
        else if (cVar2 == 'D') {
          s = &adverbs;
        }
        else {
          s = (distribution *)0x0;
        }
        iVar5 = pick_str(s,5,pcVar11);
        sVar8 = strlen(s->list[iVar5].text);
        pcVar11 = pcVar11 + (int)sVar8;
        iVar5 = (int)sVar9 + (int)sVar8;
        if (pcVar7[1] != '\0') {
          iVar5 = iVar5 + 1;
          pcVar11[1] = pcVar7[1];
          pcVar11 = pcVar11 + 1;
        }
        *pcVar11 = ' ';
        pcVar11 = pcVar11 + 1;
        sVar9 = (size_t)(iVar5 + 1);
        target = (long *)0x0;
      }
      break;
    default:
      if (bVar1 == 0) goto LAB_00106df2;
    }
    pcVar16 = pcVar16 + (int)sVar9;
    iVar3 = (int)sVar9 + iVar3;
    if ((*pbVar14 & 0xdf) != 0) {
      iVar3 = iVar3 + 1;
      pcVar16[1] = *pbVar14;
      pcVar16 = pcVar16 + 1;
    }
    goto LAB_00106c50;
  }
  *__dest = '\0';
  dbg_text_bInit = '\x01';
  if (0 < verbose) {
    fputc(10,_stderr);
  }
  goto LAB_00106ec6;
LAB_00106df2:
  *pcVar16 = '\0';
  if (iVar3 < 1) {
    fputs("Bad sentence formation",_stderr);
    abort();
  }
  lVar10 = (long)iVar3 + -1;
  pcVar16 = dbg_text::szTextPool +
            (long)(dbg_text::szTextPool +
                  (long)(dbg_text::szTextPool +
                        (long)(dbg_text::szTextPool + (0x127c5e00 - (long)pcVar13))));
  if (lVar10 < (long)pcVar16) {
    strcpy(__dest,sentence);
    pcVar13 = pcVar13 + iVar3;
    pcVar16 = __dest + lVar10;
    __dest = pcVar16 + 1;
    *pcVar16 = ' ';
  }
  else {
    (&stack0x12af1648)[(long)(pcVar16 + -0x12af1780)] = 0;
    strcpy(__dest,sentence);
    __dest = __dest + (long)pcVar16;
    pcVar13 = dbg_text::szTextPool + 0x12af1780;
  }
  goto LAB_00106bfc;
}

Assistant:

void
dbg_text(char *tgt, int min, int max, int sd)
{
   DSS_HUGE hgLength = 0,
      hgOffset,
      wordlen = 0,
      s_len,
      needed;
   char sentence[MAX_SENT_LEN + 1],
      *cp;
   static char szTextPool[TEXT_POOL_SIZE + 1];
   static int bInit = 0;
   int nLifeNoise = 0;
   
   if (!bInit)
   {
      cp = &szTextPool[0];
      if (verbose > 0)
         fprintf(stderr, "\nPreloading text ... ");
      
      while (wordlen < TEXT_POOL_SIZE)
      {
         if ((verbose > 0) && (wordlen > nLifeNoise))
         {
            nLifeNoise += 200000;
            fprintf(stderr, "%3.0f%%\b\b\b\b", (100.0 * wordlen)/TEXT_POOL_SIZE);
         }
         
         s_len = txt_sentence(sentence, 5);
         if ( s_len < 0)
            INTERNAL_ERROR("Bad sentence formation");
         needed = TEXT_POOL_SIZE - wordlen;
         if (needed >= (s_len + 1))	/* need the entire sentence */
         {
            strcpy(cp, sentence);
            cp += s_len;
            wordlen += s_len + 1;
            *(cp++) = ' ';
         }
         else /* chop the new sentence off to match the length target */
         {
            sentence[needed] = '\0';
            strcpy(cp, sentence);
            wordlen += needed;
            cp += needed;
         }
      }
      *cp = '\0';
      bInit = 1;
      if (verbose > 0)
         fprintf(stderr, "\n");
   }

   RANDOM(hgOffset, 0, TEXT_POOL_SIZE - max, sd);
   RANDOM(hgLength, min, max, sd);
   strncpy(&tgt[0], &szTextPool[hgOffset], (int)hgLength);
   tgt[hgLength] = '\0';

	return;
}